

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_elements_input_issuance_set
              (wally_tx_input *input,uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len
              ,uchar *issuance_amount,size_t issuance_amount_len,uchar *inflation_keys,
              size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len)

{
  uchar *p;
  size_t len;
  uchar *p_00;
  size_t len_00;
  uchar *p_01;
  size_t len_01;
  uchar *p_02;
  size_t len_02;
  int iVar1;
  
  p = input->issuance_amount;
  len = input->issuance_amount_len;
  p_00 = input->inflation_keys;
  len_00 = input->inflation_keys_len;
  p_01 = input->issuance_amount_rangeproof;
  len_01 = input->issuance_amount_rangeproof_len;
  p_02 = input->inflation_keys_rangeproof;
  len_02 = input->inflation_keys_rangeproof_len;
  iVar1 = tx_elements_input_issuance_init
                    (input,nonce,nonce_len,entropy,entropy_len,issuance_amount,issuance_amount_len,
                     inflation_keys,inflation_keys_len,issuance_amount_rangeproof,
                     issuance_amount_rangeproof_len,inflation_keys_rangeproof,
                     inflation_keys_rangeproof_len,true);
  if (iVar1 == 0) {
    clear_and_free(p,len);
    clear_and_free(p_00,len_00);
    clear_and_free(p_01,len_01);
    clear_and_free(p_02,len_02);
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_input_issuance_set(
    struct wally_tx_input *input,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *entropy,
    size_t entropy_len,
    const unsigned char *issuance_amount,
    size_t issuance_amount_len,
    const unsigned char *inflation_keys,
    size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *input_issuance_amount = input->issuance_amount;
    size_t input_issuance_amount_len = input->issuance_amount_len;
    unsigned char *input_inflation_keys = input->inflation_keys;
    size_t input_inflation_keys_len = input->inflation_keys_len;
    unsigned char *input_issuance_amount_rangeproof = input->issuance_amount_rangeproof;
    size_t input_issuance_amount_rangeproof_len = input->issuance_amount_rangeproof_len;
    unsigned char *input_inflation_keys_rangeproof = input->inflation_keys_rangeproof;
    size_t input_inflation_keys_rangeproof_len = input->inflation_keys_rangeproof_len;
#endif /* BUILD_ELEMENTS */
    int ret = tx_elements_input_issuance_init(input,
                                              nonce,
                                              nonce_len,
                                              entropy,
                                              entropy_len,
                                              issuance_amount,
                                              issuance_amount_len,
                                              inflation_keys,
                                              inflation_keys_len,
                                              issuance_amount_rangeproof,
                                              issuance_amount_rangeproof_len,
                                              inflation_keys_rangeproof,
                                              inflation_keys_rangeproof_len,
                                              true);
#ifdef BUILD_ELEMENTS
    if (ret == WALLY_OK) {
        clear_and_free(input_issuance_amount, input_issuance_amount_len);
        clear_and_free(input_inflation_keys, input_inflation_keys_len);
        clear_and_free(input_issuance_amount_rangeproof, input_issuance_amount_rangeproof_len);
        clear_and_free(input_inflation_keys_rangeproof, input_inflation_keys_rangeproof_len);
    }
#endif /* BUILD_ELEMENTS */
    return ret;
}